

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O3

BindResult __thiscall
QOpenGLTextureCache::bindTexture
          (QOpenGLTextureCache *this,QOpenGLContext *context,QPixmap *pixmap,BindOptions options)

{
  QMutex *pQVar1;
  __pointer_type pQVar2;
  char cVar3;
  unsigned_long_long key;
  BindResult BVar4;
  QOpenGLCachedTexture *pQVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  unsigned_long_long local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QPixmap::isNull();
  BVar4.id = 0;
  BVar4.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
  super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
       (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0x0;
  uVar7 = 0;
  if (cVar3 != '\0') goto LAB_0015fb0f;
  pQVar1 = &this->m_mutex;
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar8) goto LAB_0015fa4e;
  }
  else {
LAB_0015fa4e:
    QBasicMutex::lockInternal();
  }
  key = QPixmap::cacheKey();
  if (((*(short *)(pixmap + 8) == 0) &&
      (local_50[0] = key,
      pQVar5 = QCache<unsigned_long_long,_QOpenGLCachedTexture>::relink(&this->m_cache,local_50),
      pQVar5 != (QOpenGLCachedTexture *)0x0)) &&
     ((QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>)
      (pQVar5->m_options).super_QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>.
      super_QFlagsStorage<QOpenGLTextureUploader::BindOption>.i ==
      (QFlagsStorage<QOpenGLTextureUploader::BindOption>)
      options.super_QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>.
      super_QFlagsStorage<QOpenGLTextureUploader::BindOption>.i)) {
    puVar6 = (undefined8 *)QOpenGLContext::functions();
    (**(code **)*puVar6)(0xde1);
    BVar4.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
    super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
         (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0x0;
    BVar4.id = *(uint *)(pQVar5->m_resource + 0x10);
    uVar7 = 0;
  }
  else {
    QPixmap::toImage();
    BVar4 = bindTexture(this,context,key,(QImage *)local_50,options);
    uVar7 = (ulong)BVar4 >> 0x20;
    QImage::~QImage((QImage *)local_50);
    if (BVar4.id == 0) {
      BVar4.id = 0;
      BVar4.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
      super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
           (QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>)0x0;
    }
    else {
      QImagePixmapCleanupHooks::enableCleanupHooks(pixmap);
    }
  }
  LOCK();
  pQVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
  }
LAB_0015fb0f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (BindResult)((ulong)BVar4 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

QOpenGLTextureCache::BindResult QOpenGLTextureCache::bindTexture(QOpenGLContext *context,
                                                                 const QPixmap &pixmap,
                                                                 QOpenGLTextureUploader::BindOptions options)
{
    if (pixmap.isNull())
        return { 0, {} };
    QMutexLocker locker(&m_mutex);
    qint64 key = pixmap.cacheKey();

    // A QPainter is active on the image - take the safe route and replace the texture.
    if (!pixmap.paintingActive()) {
        QOpenGLCachedTexture *entry = m_cache.object(key);
        if (entry && entry->options() == options) {
            context->functions()->glBindTexture(GL_TEXTURE_2D, entry->id());
            return { entry->id(), {} };
        }
    }

    BindResult result = bindTexture(context, key, pixmap.toImage(), options);
    if (result.id > 0)
        QImagePixmapCleanupHooks::enableCleanupHooks(pixmap);

    return result;
}